

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O2

bool __thiscall
bssl::SSLAEADContext::Seal
          (SSLAEADContext *this,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t type,
          uint16_t record_version,uint64_t seqnum,Span<const_unsigned_char> header,uint8_t *in,
          size_t in_len)

{
  bool bVar1;
  int reason;
  int lib;
  int line;
  ulong uVar2;
  ulong uVar3;
  size_t suffix_len;
  size_t *local_38;
  
  uVar2 = (ulong)this->variable_nonce_len_;
  if ((this->field_0x26a & 1) == 0) {
    uVar2 = 0;
  }
  bVar1 = SuffixLen(this,&suffix_len,in_len,0);
  if (bVar1) {
    uVar3 = uVar2 + in_len;
    local_38 = out_len;
    if ((CARRY8(uVar2,in_len)) || (CARRY8(suffix_len,uVar3))) {
      lib = 0x1e;
      reason = 200;
      line = 0x18b;
    }
    else {
      if (suffix_len + uVar3 <= max_out_len) {
        bVar1 = SealScatter(this,out,out + uVar2,out + uVar2 + in_len,type,record_version,seqnum,
                            header,in,in_len,(uint8_t *)0x0,0);
        if (bVar1) {
          *local_38 = uVar3 + suffix_len;
          return true;
        }
        return false;
      }
      lib = 0x10;
      reason = 0x79;
      line = 399;
    }
  }
  else {
    lib = 0x10;
    reason = 200;
    line = 0x186;
  }
  ERR_put_error(lib,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                ,line);
  return false;
}

Assistant:

bool SSLAEADContext::Seal(uint8_t *out, size_t *out_len, size_t max_out_len,
                          uint8_t type, uint16_t record_version,
                          uint64_t seqnum, Span<const uint8_t> header,
                          const uint8_t *in, size_t in_len) {
  const size_t prefix_len = ExplicitNonceLen();
  size_t suffix_len;
  if (!SuffixLen(&suffix_len, in_len, 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (in_len + prefix_len < in_len ||
      in_len + prefix_len + suffix_len < in_len + prefix_len) {
    OPENSSL_PUT_ERROR(CIPHER, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (in_len + prefix_len + suffix_len > max_out_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BUFFER_TOO_SMALL);
    return false;
  }

  if (!SealScatter(out, out + prefix_len, out + prefix_len + in_len, type,
                   record_version, seqnum, header, in, in_len, 0, 0)) {
    return false;
  }
  *out_len = prefix_len + in_len + suffix_len;
  return true;
}